

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O3

int crypto::pbkdf2<crypto::iterated_hash<crypto::sha256_transform>_>::derive
              (EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long extraout_RAX;
  long lVar6;
  size_t in_RCX;
  ulong uVar7;
  size_t __n;
  ulong in_R8;
  void *in_R9;
  ulong in_stack_00000008;
  char f [32];
  state_t istate;
  char u [32];
  state_t ostate;
  hmac_t mac;
  void *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  size_t *local_118;
  size_t local_110;
  long local_108;
  ulong local_100;
  hash_word local_f8 [2];
  hash_word ahStack_f0 [2];
  hash_word local_e8 [2];
  hash_word ahStack_e0 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  hash_word local_b8 [8];
  iterated_hash<crypto::sha256_transform> local_98;
  
  local_118 = keylen;
  local_110 = in_RCX;
  hmac<crypto::iterated_hash<crypto::sha256_transform>_>::prepare_state
            ((char *)ctx,(size_t)key,local_f8,local_b8);
  local_108 = extraout_RAX;
  if (in_stack_00000008 != 0) {
    local_108 = 1;
    local_140 = in_R9;
    do {
      uVar5 = (uint)local_108;
      local_138 = CONCAT44(local_138._4_4_,
                           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                           uVar5 << 0x18);
      local_98.count_lo = 0x40;
      local_98.count_hi = 0;
      local_98.state[4] = local_e8[0];
      local_98.state[5] = local_e8[1];
      local_98.state[6] = ahStack_e0[0];
      local_98.state[7] = ahStack_e0[1];
      local_98.state[0] = local_f8[0];
      local_98.state[1] = local_f8[1];
      local_98.state[2] = ahStack_f0[0];
      local_98.state[3] = ahStack_f0[1];
      iterated_hash<crypto::sha256_transform>::update(&local_98,(char *)local_118,local_110);
      iterated_hash<crypto::sha256_transform>::update(&local_98,(char *)&local_138,4);
      hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
                ((hmac<crypto::iterated_hash<crypto::sha256_transform>_> *)&local_98,local_b8,
                 (char *)&local_d8);
      local_128 = local_c8;
      uStack_120 = uStack_c0;
      local_138 = local_d8;
      uStack_130 = uStack_d0;
      if (1 < in_R8) {
        uVar7 = 1;
        do {
          local_98.count_lo = 0x40;
          local_98.count_hi = 0;
          local_98.state[4] = local_e8[0];
          local_98.state[5] = local_e8[1];
          local_98.state[6] = ahStack_e0[0];
          local_98.state[7] = ahStack_e0[1];
          local_98.state[0] = local_f8[0];
          local_98.state[1] = local_f8[1];
          local_98.state[2] = ahStack_f0[0];
          local_98.state[3] = ahStack_f0[1];
          iterated_hash<crypto::sha256_transform>::update(&local_98,(char *)&local_d8,0x20);
          hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
                    ((hmac<crypto::iterated_hash<crypto::sha256_transform>_> *)&local_98,local_b8,
                     (char *)&local_d8);
          lVar6 = 0;
          do {
            uVar5 = *(uint *)((long)&local_d8 + lVar6 + 4);
            uVar1 = *(uint *)((long)&uStack_d0 + lVar6);
            uVar2 = *(uint *)((long)&uStack_d0 + lVar6 + 4);
            uVar3 = *(uint *)((long)&uStack_130 + lVar6);
            uVar4 = *(uint *)((long)&uStack_130 + lVar6 + 4);
            *(uint *)((long)&local_138 + lVar6) =
                 *(uint *)((long)&local_d8 + lVar6) ^ *(uint *)((long)&local_138 + lVar6);
            *(uint *)((long)&local_138 + lVar6 + 4) =
                 uVar5 ^ *(uint *)((long)&local_138 + lVar6 + 4);
            *(uint *)((long)&uStack_130 + lVar6) = uVar1 ^ uVar3;
            *(uint *)((long)&uStack_130 + lVar6 + 4) = uVar2 ^ uVar4;
            lVar6 = lVar6 + 0x10;
          } while (lVar6 != 0x20);
          uVar7 = uVar7 + 1;
        } while (uVar7 != in_R8);
      }
      __n = 0x20;
      if (in_stack_00000008 < 0x20) {
        __n = in_stack_00000008;
      }
      local_100 = in_stack_00000008;
      memcpy(local_140,&local_138,__n);
      local_140 = (void *)((long)local_140 + __n);
      local_108 = local_108 + 1;
      in_stack_00000008 = local_100 - __n;
    } while (in_stack_00000008 != 0);
  }
  return (int)local_108;
}

Assistant:

static void derive(const char * password, size_t password_length, const char * salt, size_t salt_length,
	                   size_t iterations, char * key, size_t key_length) {
		
		typename hmac_t::state_t istate, ostate;
		hmac_t::prepare_state(password, password_length, istate, ostate);
		
		for(size_t block = 1; key_length > 0; block++) {
			
			char u[hash_size];
			{
				char b[4] = { char(block >> 24), char(block >> 16), char(block >> 8), char(block) };
				hmac_t mac;
				mac.init(istate);
				mac.update(salt, salt_length);
				mac.update(b, sizeof(b));
				mac.finalize(ostate, u);
			}
			char f[hash_size];
			std::memcpy(f, u, hash_size);
			
			for(size_t i = 1; i < iterations; i++) {
				hmac_t mac;
				mac.init(istate);
				mac.update(u, hash_size);
				mac.finalize(ostate, u);
				for(size_t j = 0; j < hash_size; j++) {
					f[j] = char(boost::uint8_t(f[j]) ^ boost::uint8_t(u[j]));
				}
			}
			
			size_t n = std::min(size_t(hash_size), key_length);
			std::memcpy(key, f, n);
			key += n;
			key_length -= n;
		}
		
	}